

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set_test.cc
# Opt level: O1

void __thiscall leveldb::FindFileTest_Multiple_Test::TestBody(FindFileTest_Multiple_Test *this)

{
  char cVar1;
  size_type sVar2;
  bool bVar3;
  pointer *__ptr;
  char *pcVar4;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  AssertHelper local_68;
  AssertionResult local_60;
  string local_50;
  AssertHelper local_30;
  
  FindFileTest::Add(&this->super_FindFileTest,"150","200",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"200","250",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"300","350",100,100);
  FindFileTest::Add(&this->super_FindFileTest,"400","450",100,100);
  local_60.success_ = false;
  local_60._1_3_ = 0;
  local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"100");
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&local_50,"0","Find(\"100\")",(int *)&local_60,(int *)&local_68);
  cVar1 = (char)local_50._M_dataplus._M_p;
  if ((char)local_50._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_60);
    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)local_50._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_68,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
               ,0x61,pcVar4);
    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper(&local_68);
    if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
    }
  }
  sVar2 = local_50._M_string_length;
  if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
    if (*(undefined8 **)local_50._M_string_length !=
        (undefined8 *)(local_50._M_string_length + 0x10)) {
      operator_delete(*(undefined8 **)local_50._M_string_length);
    }
    operator_delete((void *)sVar2);
  }
  if (cVar1 != '\0') {
    local_60.success_ = false;
    local_60._1_3_ = 0;
    local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"150");
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&local_50,"0","Find(\"150\")",(int *)&local_60,(int *)&local_68);
    cVar1 = (char)local_50._M_dataplus._M_p;
    if ((char)local_50._M_dataplus._M_p == '\0') {
      testing::Message::Message((Message *)&local_60);
      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
        pcVar4 = "";
      }
      else {
        pcVar4 = *(char **)local_50._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_68,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                 ,0x62,pcVar4);
      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
      testing::internal::AssertHelper::~AssertHelper(&local_68);
      if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
      }
    }
    sVar2 = local_50._M_string_length;
    if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
      if (*(undefined8 **)local_50._M_string_length !=
          (undefined8 *)(local_50._M_string_length + 0x10)) {
        operator_delete(*(undefined8 **)local_50._M_string_length);
      }
      operator_delete((void *)sVar2);
    }
    if (cVar1 != '\0') {
      local_60.success_ = false;
      local_60._1_3_ = 0;
      local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"151");
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)&local_50,"0","Find(\"151\")",(int *)&local_60,(int *)&local_68);
      cVar1 = (char)local_50._M_dataplus._M_p;
      if ((char)local_50._M_dataplus._M_p == '\0') {
        testing::Message::Message((Message *)&local_60);
        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
          pcVar4 = "";
        }
        else {
          pcVar4 = *(char **)local_50._M_string_length;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_68,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                   ,99,pcVar4);
        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
        testing::internal::AssertHelper::~AssertHelper(&local_68);
        if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
        }
      }
      sVar2 = local_50._M_string_length;
      if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
        if (*(undefined8 **)local_50._M_string_length !=
            (undefined8 *)(local_50._M_string_length + 0x10)) {
          operator_delete(*(undefined8 **)local_50._M_string_length);
        }
        operator_delete((void *)sVar2);
      }
      if (cVar1 != '\0') {
        local_60.success_ = false;
        local_60._1_3_ = 0;
        local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"199");
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)&local_50,"0","Find(\"199\")",(int *)&local_60,(int *)&local_68);
        cVar1 = (char)local_50._M_dataplus._M_p;
        if ((char)local_50._M_dataplus._M_p == '\0') {
          testing::Message::Message((Message *)&local_60);
          if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
            pcVar4 = "";
          }
          else {
            pcVar4 = *(char **)local_50._M_string_length;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_68,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                     ,100,pcVar4);
          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
          testing::internal::AssertHelper::~AssertHelper(&local_68);
          if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
          }
        }
        sVar2 = local_50._M_string_length;
        if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
          if (*(undefined8 **)local_50._M_string_length !=
              (undefined8 *)(local_50._M_string_length + 0x10)) {
            operator_delete(*(undefined8 **)local_50._M_string_length);
          }
          operator_delete((void *)sVar2);
        }
        if (cVar1 != '\0') {
          local_60.success_ = false;
          local_60._1_3_ = 0;
          local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"200");
          testing::internal::CmpHelperEQ<int,int>
                    ((internal *)&local_50,"0","Find(\"200\")",(int *)&local_60,(int *)&local_68);
          cVar1 = (char)local_50._M_dataplus._M_p;
          if ((char)local_50._M_dataplus._M_p == '\0') {
            testing::Message::Message((Message *)&local_60);
            if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
              pcVar4 = "";
            }
            else {
              pcVar4 = *(char **)local_50._M_string_length;
            }
            testing::internal::AssertHelper::AssertHelper
                      (&local_68,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                       ,0x65,pcVar4);
            testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
            testing::internal::AssertHelper::~AssertHelper(&local_68);
            if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
              (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
            }
          }
          sVar2 = local_50._M_string_length;
          if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
            if (*(undefined8 **)local_50._M_string_length !=
                (undefined8 *)(local_50._M_string_length + 0x10)) {
              operator_delete(*(undefined8 **)local_50._M_string_length);
            }
            operator_delete((void *)sVar2);
          }
          if (cVar1 != '\0') {
            local_60.success_ = true;
            local_60._1_3_ = 0;
            local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"201");
            testing::internal::CmpHelperEQ<int,int>
                      ((internal *)&local_50,"1","Find(\"201\")",(int *)&local_60,(int *)&local_68);
            cVar1 = (char)local_50._M_dataplus._M_p;
            if ((char)local_50._M_dataplus._M_p == '\0') {
              testing::Message::Message((Message *)&local_60);
              if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                pcVar4 = "";
              }
              else {
                pcVar4 = *(char **)local_50._M_string_length;
              }
              testing::internal::AssertHelper::AssertHelper
                        (&local_68,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                         ,0x66,pcVar4);
              testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
              testing::internal::AssertHelper::~AssertHelper(&local_68);
              if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
              }
            }
            sVar2 = local_50._M_string_length;
            if ((undefined8 *)local_50._M_string_length != (undefined8 *)0x0) {
              if (*(undefined8 **)local_50._M_string_length !=
                  (undefined8 *)(local_50._M_string_length + 0x10)) {
                operator_delete(*(undefined8 **)local_50._M_string_length);
              }
              operator_delete((void *)sVar2);
            }
            if (cVar1 != '\0') {
              local_60.success_ = true;
              local_60._1_3_ = 0;
              local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"249");
              testing::internal::CmpHelperEQ<int,int>
                        ((internal *)&local_50,"1","Find(\"249\")",(int *)&local_60,(int *)&local_68
                        );
              if ((char)local_50._M_dataplus._M_p == '\0') {
                testing::Message::Message((Message *)&local_60);
                if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                  pcVar4 = "";
                }
                else {
                  pcVar4 = *(char **)local_50._M_string_length;
                }
                testing::internal::AssertHelper::AssertHelper
                          (&local_68,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                           ,0x67,pcVar4);
                testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
                testing::internal::AssertHelper::~AssertHelper(&local_68);
                if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                  (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
              }
              else {
                testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                local_60.success_ = true;
                local_60._1_3_ = 0;
                local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"250");
                testing::internal::CmpHelperEQ<int,int>
                          ((internal *)&local_50,"1","Find(\"250\")",(int *)&local_60,
                           (int *)&local_68);
                if ((char)local_50._M_dataplus._M_p == '\0') {
                  testing::Message::Message((Message *)&local_60);
                  if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                    pcVar4 = "";
                  }
                  else {
                    pcVar4 = *(char **)local_50._M_string_length;
                  }
                  testing::internal::AssertHelper::AssertHelper
                            (&local_68,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                             ,0x68,pcVar4);
                  testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                  if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                    (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                }
                else {
                  testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                  local_60.success_ = true;
                  local_60._1_3_ = 0;
                  local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"251");
                  testing::internal::CmpHelperEQ<int,int>
                            ((internal *)&local_50,"2","Find(\"251\")",(int *)&local_60,
                             (int *)&local_68);
                  if ((char)local_50._M_dataplus._M_p == '\0') {
                    testing::Message::Message((Message *)&local_60);
                    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                      pcVar4 = "";
                    }
                    else {
                      pcVar4 = *(char **)local_50._M_string_length;
                    }
                    testing::internal::AssertHelper::AssertHelper
                              (&local_68,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                               ,0x69,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
                    testing::internal::AssertHelper::~AssertHelper(&local_68);
                    if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                      (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                  }
                  else {
                    testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                    local_60.success_ = true;
                    local_60._1_3_ = 0;
                    local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"299");
                    testing::internal::CmpHelperEQ<int,int>
                              ((internal *)&local_50,"2","Find(\"299\")",(int *)&local_60,
                               (int *)&local_68);
                    if ((char)local_50._M_dataplus._M_p == '\0') {
                      testing::Message::Message((Message *)&local_60);
                      if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                        pcVar4 = "";
                      }
                      else {
                        pcVar4 = *(char **)local_50._M_string_length;
                      }
                      testing::internal::AssertHelper::AssertHelper
                                (&local_68,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                 ,0x6a,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
                      testing::internal::AssertHelper::~AssertHelper(&local_68);
                      if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                        (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                    }
                    else {
                      testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                      local_60.success_ = true;
                      local_60._1_3_ = 0;
                      local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"300");
                      testing::internal::CmpHelperEQ<int,int>
                                ((internal *)&local_50,"2","Find(\"300\")",(int *)&local_60,
                                 (int *)&local_68);
                      if ((char)local_50._M_dataplus._M_p == '\0') {
                        testing::Message::Message((Message *)&local_60);
                        if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                          pcVar4 = "";
                        }
                        else {
                          pcVar4 = *(char **)local_50._M_string_length;
                        }
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_68,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                   ,0x6b,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60);
                        testing::internal::AssertHelper::~AssertHelper(&local_68);
                        if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                          (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                      }
                      else {
                        testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                        local_60.success_ = true;
                        local_60._1_3_ = 0;
                        local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"349");
                        testing::internal::CmpHelperEQ<int,int>
                                  ((internal *)&local_50,"2","Find(\"349\")",(int *)&local_60,
                                   (int *)&local_68);
                        if ((char)local_50._M_dataplus._M_p == '\0') {
                          testing::Message::Message((Message *)&local_60);
                          if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                            pcVar4 = "";
                          }
                          else {
                            pcVar4 = *(char **)local_50._M_string_length;
                          }
                          testing::internal::AssertHelper::AssertHelper
                                    (&local_68,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                     ,0x6c,pcVar4);
                          testing::internal::AssertHelper::operator=(&local_68,(Message *)&local_60)
                          ;
                          testing::internal::AssertHelper::~AssertHelper(&local_68);
                          if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                            (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                        }
                        else {
                          testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50);
                          local_60.success_ = true;
                          local_60._1_3_ = 0;
                          local_68.data_._0_4_ = FindFileTest::Find(&this->super_FindFileTest,"350")
                          ;
                          testing::internal::CmpHelperEQ<int,int>
                                    ((internal *)&local_50,"2","Find(\"350\")",(int *)&local_60,
                                     (int *)&local_68);
                          if ((char)local_50._M_dataplus._M_p == '\0') {
                            testing::Message::Message((Message *)&local_60);
                            if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                              pcVar4 = "";
                            }
                            else {
                              pcVar4 = *(char **)local_50._M_string_length;
                            }
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_68,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                       ,0x6d,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      (&local_68,(Message *)&local_60);
                            testing::internal::AssertHelper::~AssertHelper(&local_68);
                            if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                              (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))();
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50)
                            ;
                          }
                          else {
                            testing::AssertionResult::~AssertionResult((AssertionResult *)&local_50)
                            ;
                            local_60.success_ = true;
                            local_60._1_3_ = 0;
                            local_68.data_._0_4_ =
                                 FindFileTest::Find(&this->super_FindFileTest,"351");
                            testing::internal::CmpHelperEQ<int,int>
                                      ((internal *)&local_50,"3","Find(\"351\")",(int *)&local_60,
                                       (int *)&local_68);
                            if ((char)local_50._M_dataplus._M_p == '\0') {
                              testing::Message::Message((Message *)&local_60);
                              if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                                pcVar4 = "";
                              }
                              else {
                                pcVar4 = *(char **)local_50._M_string_length;
                              }
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_68,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                         ,0x6e,pcVar4);
                              testing::internal::AssertHelper::operator=
                                        (&local_68,(Message *)&local_60);
                              testing::internal::AssertHelper::~AssertHelper(&local_68);
                              if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0) {
                                (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8))
                                          ();
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_50);
                            }
                            else {
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)&local_50);
                              local_60.success_ = true;
                              local_60._1_3_ = 0;
                              local_68.data_._0_4_ =
                                   FindFileTest::Find(&this->super_FindFileTest,"400");
                              testing::internal::CmpHelperEQ<int,int>
                                        ((internal *)&local_50,"3","Find(\"400\")",(int *)&local_60,
                                         (int *)&local_68);
                              if ((char)local_50._M_dataplus._M_p == '\0') {
                                testing::Message::Message((Message *)&local_60);
                                if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0) {
                                  pcVar4 = "";
                                }
                                else {
                                  pcVar4 = *(char **)local_50._M_string_length;
                                }
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_68,kFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                           ,0x6f,pcVar4);
                                testing::internal::AssertHelper::operator=
                                          (&local_68,(Message *)&local_60);
                                testing::internal::AssertHelper::~AssertHelper(&local_68);
                                if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0)
                                {
                                  (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) + 8)
                                  )();
                                }
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)&local_50);
                              }
                              else {
                                testing::AssertionResult::~AssertionResult
                                          ((AssertionResult *)&local_50);
                                local_60.success_ = true;
                                local_60._1_3_ = 0;
                                local_68.data_._0_4_ =
                                     FindFileTest::Find(&this->super_FindFileTest,"450");
                                testing::internal::CmpHelperEQ<int,int>
                                          ((internal *)&local_50,"3","Find(\"450\")",
                                           (int *)&local_60,(int *)&local_68);
                                if ((char)local_50._M_dataplus._M_p == '\0') {
                                  testing::Message::Message((Message *)&local_60);
                                  if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0)
                                  {
                                    pcVar4 = "";
                                  }
                                  else {
                                    pcVar4 = *(char **)local_50._M_string_length;
                                  }
                                  testing::internal::AssertHelper::AssertHelper
                                            (&local_68,kFatalFailure,
                                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                             ,0x70,pcVar4);
                                  testing::internal::AssertHelper::operator=
                                            (&local_68,(Message *)&local_60);
                                  testing::internal::AssertHelper::~AssertHelper(&local_68);
                                  if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) != (long *)0x0
                                     ) {
                                    (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_) +
                                                8))();
                                  }
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&local_50);
                                }
                                else {
                                  testing::AssertionResult::~AssertionResult
                                            ((AssertionResult *)&local_50);
                                  local_60.success_ = true;
                                  local_60._1_3_ = 0;
                                  local_68.data_._0_4_ =
                                       FindFileTest::Find(&this->super_FindFileTest,"451");
                                  testing::internal::CmpHelperEQ<int,int>
                                            ((internal *)&local_50,"4","Find(\"451\")",
                                             (int *)&local_60,(int *)&local_68);
                                  if ((char)local_50._M_dataplus._M_p == '\0') {
                                    testing::Message::Message((Message *)&local_60);
                                    if ((undefined8 *)local_50._M_string_length == (undefined8 *)0x0
                                       ) {
                                      pcVar4 = "";
                                    }
                                    else {
                                      pcVar4 = *(char **)local_50._M_string_length;
                                    }
                                    testing::internal::AssertHelper::AssertHelper
                                              (&local_68,kFatalFailure,
                                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                               ,0x71,pcVar4);
                                    testing::internal::AssertHelper::operator=
                                              (&local_68,(Message *)&local_60);
                                    testing::internal::AssertHelper::~AssertHelper(&local_68);
                                    if ((long *)CONCAT44(local_60._4_4_,local_60._0_4_) !=
                                        (long *)0x0) {
                                      (**(code **)(*(long *)CONCAT44(local_60._4_4_,local_60._0_4_)
                                                  + 8))();
                                    }
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)&local_50);
                                  }
                                  else {
                                    testing::AssertionResult::~AssertionResult
                                              ((AssertionResult *)&local_50);
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","149");
                                    local_60.success_ = !bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (!bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"!Overlaps(\"100\", \"149\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x73,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"251","299");
                                    local_60.success_ = !bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (!bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"!Overlaps(\"251\", \"299\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x74,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"451","500");
                                    local_60.success_ = !bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (!bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"!Overlaps(\"451\", \"500\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x75,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"351","399");
                                    local_60.success_ = !bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (!bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"!Overlaps(\"351\", \"399\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x76,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","150");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"100\", \"150\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x78,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","200");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"100\", \"200\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x79,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","300");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"100\", \"300\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7a,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","400");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"100\", \"400\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7b,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"100","500");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"100\", \"500\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7c,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"375","400");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"375\", \"400\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7d,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"450","450");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (bVar3) {
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                    }
                                    else {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"450\", \"450\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7e,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                      testing::AssertionResult::~AssertionResult(&local_60);
                                      if (!bVar3) {
                                        return;
                                      }
                                    }
                                    bVar3 = FindFileTest::Overlaps
                                                      (&this->super_FindFileTest,"450","500");
                                    local_60.success_ = bVar3;
                                    local_60.message_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl =
                                         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
                                          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )0x0;
                                    if (!bVar3) {
                                      testing::Message::Message((Message *)&local_68);
                                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                                (&local_50,(internal *)&local_60,
                                                 (AssertionResult *)"Overlaps(\"450\", \"500\")",
                                                 "false","true",in_R9);
                                      testing::internal::AssertHelper::AssertHelper
                                                (&local_30,kFatalFailure,
                                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/version_set_test.cc"
                                                 ,0x7f,(char *)CONCAT71(local_50._M_dataplus._M_p.
                                                                        _1_7_,(char)local_50.
                                                  _M_dataplus._M_p));
                                      testing::internal::AssertHelper::operator=
                                                (&local_30,(Message *)&local_68);
                                      testing::internal::AssertHelper::~AssertHelper(&local_30);
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                      (char)local_50._M_dataplus._M_p) !=
                                          &local_50.field_2) {
                                        operator_delete((undefined1 *)
                                                        CONCAT71(local_50._M_dataplus._M_p._1_7_,
                                                                 (char)local_50._M_dataplus._M_p));
                                      }
                                      if ((long *)CONCAT44(local_68.data_._4_4_,(int)local_68.data_)
                                          != (long *)0x0) {
                                        (**(code **)(*(long *)CONCAT44(local_68.data_._4_4_,
                                                                       (int)local_68.data_) + 8))();
                                      }
                                    }
                                    testing::AssertionResult::~AssertionResult(&local_60);
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(FindFileTest, Multiple) {
  Add("150", "200");
  Add("200", "250");
  Add("300", "350");
  Add("400", "450");
  ASSERT_EQ(0, Find("100"));
  ASSERT_EQ(0, Find("150"));
  ASSERT_EQ(0, Find("151"));
  ASSERT_EQ(0, Find("199"));
  ASSERT_EQ(0, Find("200"));
  ASSERT_EQ(1, Find("201"));
  ASSERT_EQ(1, Find("249"));
  ASSERT_EQ(1, Find("250"));
  ASSERT_EQ(2, Find("251"));
  ASSERT_EQ(2, Find("299"));
  ASSERT_EQ(2, Find("300"));
  ASSERT_EQ(2, Find("349"));
  ASSERT_EQ(2, Find("350"));
  ASSERT_EQ(3, Find("351"));
  ASSERT_EQ(3, Find("400"));
  ASSERT_EQ(3, Find("450"));
  ASSERT_EQ(4, Find("451"));

  ASSERT_TRUE(!Overlaps("100", "149"));
  ASSERT_TRUE(!Overlaps("251", "299"));
  ASSERT_TRUE(!Overlaps("451", "500"));
  ASSERT_TRUE(!Overlaps("351", "399"));

  ASSERT_TRUE(Overlaps("100", "150"));
  ASSERT_TRUE(Overlaps("100", "200"));
  ASSERT_TRUE(Overlaps("100", "300"));
  ASSERT_TRUE(Overlaps("100", "400"));
  ASSERT_TRUE(Overlaps("100", "500"));
  ASSERT_TRUE(Overlaps("375", "400"));
  ASSERT_TRUE(Overlaps("450", "450"));
  ASSERT_TRUE(Overlaps("450", "500"));
}